

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coreTests.cpp
# Opt level: O0

bool ContainsMacro(Preprocessor *preprocessor,string *macroIdentifier)

{
  bool bVar1;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  local_70 [3];
  string *local_58;
  TMacroDesc *local_50;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  local_48;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  local_40;
  __normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
  it;
  TSymTable *symTable;
  string *macroIdentifier_local;
  Preprocessor *preprocessor_local;
  
  tcpp::Preprocessor::GetSymbolsTable((TSymTable *)&it,preprocessor);
  local_48._M_current =
       (TMacroDesc *)
       std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>::cbegin
                 ((vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_> *)&it);
  local_50 = (TMacroDesc *)
             std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>::cend
                       ((vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_> *)&it);
  local_58 = macroIdentifier;
  local_40 = std::
             find_if<__gnu_cxx::__normal_iterator<tcpp::TMacroDesc_const*,std::vector<tcpp::TMacroDesc,std::allocator<tcpp::TMacroDesc>>>,ContainsMacro(tcpp::Preprocessor_const&,std::__cxx11::string_const&)::__0>
                       (local_48,(__normal_iterator<const_tcpp::TMacroDesc_*,_std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>_>
                                  )local_50,(anon_class_8_1_d560b775_for__M_pred)macroIdentifier);
  local_70[0]._M_current =
       (TMacroDesc *)
       std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>::cend
                 ((vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_> *)&it);
  bVar1 = __gnu_cxx::operator!=(&local_40,local_70);
  std::vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_>::~vector
            ((vector<tcpp::TMacroDesc,_std::allocator<tcpp::TMacroDesc>_> *)&it);
  return bVar1;
}

Assistant:

static bool ContainsMacro(const Preprocessor& preprocessor, const std::string& macroIdentifier)
{
	const auto& symTable = preprocessor.GetSymbolsTable();

	auto it = std::find_if(symTable.cbegin(), symTable.cend(), [&macroIdentifier](auto&& symTableEntry)
	{
		return symTableEntry.mName == macroIdentifier;
	});

	return it != symTable.cend();
}